

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::IsCrossFileMaybeMap(FieldDescriptor *field)

{
  bool bVar1;
  FieldDescriptor *field_local;
  
  bVar1 = IsCrossFileMapField(field);
  if (bVar1) {
    field_local._7_1_ = true;
  }
  else {
    field_local._7_1_ = IsCrossFileMessage(field);
  }
  return field_local._7_1_;
}

Assistant:

bool IsCrossFileMaybeMap(const FieldDescriptor* field) {
  if (IsCrossFileMapField(field)) {
    return true;
  }

  return IsCrossFileMessage(field);
}